

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

jlong Java_fr_limsi_wapiti_WapitiJNI_loadModel(JNIEnv *jenv,jclass jcls,jstring jarg1)

{
  char *arg;
  mdl_t *pmVar1;
  
  if (jarg1 == (jstring)0x0) {
    arg = (char *)0x0;
  }
  else {
    arg = (*jenv->functions->GetStringUTFChars)(jenv,jarg1,(jboolean *)0x0);
    if (arg == (char *)0x0) {
      return 0;
    }
  }
  pmVar1 = loadModel(arg);
  if (arg != (char *)0x0) {
    (*jenv->functions->ReleaseStringUTFChars)(jenv,jarg1,arg);
  }
  return (jlong)pmVar1;
}

Assistant:

SWIGEXPORT jlong JNICALL Java_fr_limsi_wapiti_WapitiJNI_loadModel(JNIEnv *jenv, jclass jcls, jstring jarg1) {
  jlong jresult = 0 ;
  char *arg1 = (char *) 0 ;
  mdl_t *result = 0 ;
  
  (void)jenv;
  (void)jcls;
  arg1 = 0;
  if (jarg1) {
    arg1 = (char *)jenv->GetStringUTFChars(jarg1, 0);
    if (!arg1) return 0;
  }
  {
    try {
      result = (mdl_t *)loadModel(arg1); 
    }
    catch (char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, e); return 0; 
      }; 
    }
    catch (const char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, (char*)e); return 0; 
      }; 
    }
  }
  *(mdl_t **)&jresult = result; 
  if (arg1) jenv->ReleaseStringUTFChars(jarg1, (const char *)arg1);
  return jresult;
}